

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O2

ParameterError secs2ms(long *valp,char *str)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ParameterError PVar5;
  char *str_local;
  long local_28;
  curl_off_t secs;
  
  PVar5 = PARAM_BAD_NUMERIC;
  if ((str != (char *)0x0) &&
     (str_local = str, iVar2 = Curl_str_number(&str_local,&secs,0x20c49ba5e353f6), iVar2 == 0)) {
    iVar2 = Curl_str_single(&str_local,'.');
    pcVar1 = str_local;
    PVar5 = PARAM_OK;
    if (iVar2 == 0) {
      iVar2 = Curl_str_number(&str_local,&local_28,0x7fffffffffffffff);
      if (iVar2 != 0) {
        return PARAM_NUMBER_TOO_LARGE;
      }
      uVar4 = (long)str_local - (long)pcVar1;
      for (; 0x147ae147ae147ae < local_28 || 8 < uVar4; local_28 = local_28 / 10) {
        uVar4 = uVar4 - 1;
      }
      lVar3 = (local_28 * 100) / (long)(ulong)*(uint *)(&UNK_00128a6c + uVar4 * 4);
    }
    else {
      lVar3 = 0;
    }
    *valp = secs * 1000 + lVar3;
  }
  return PVar5;
}

Assistant:

ParameterError secs2ms(long *valp, const char *str)
{
  curl_off_t secs;
  long ms = 0;
  const unsigned int digs[] = { 1, 10, 100, 1000, 10000, 1000000,
    1000000, 10000000, 100000000 };
  if(!str ||
     curlx_str_number(&str, &secs, LONG_MAX/1000 - 1))
    return PARAM_BAD_NUMERIC;
  if(!curlx_str_single(&str, '.')) {
    curl_off_t fracs;
    const char *s = str;
    size_t len;
    if(curlx_str_number(&str, &fracs, CURL_OFF_T_MAX))
      return PARAM_NUMBER_TOO_LARGE;
    /* how many milliseconds are in fracs ? */
    len = (str - s);
    while((len > sizeof(CURL_ARRAYSIZE(digs)) || (fracs > LONG_MAX/100))) {
      fracs /= 10;
      len--;
    }
    ms = ((long)fracs * 100) / digs[len - 1];
  }

  *valp = (long)secs * 1000 + ms;
  return PARAM_OK;
}